

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

void __thiscall
spectest::CommandRunner::PopulateExports(CommandRunner *this,Ptr *instance,ExportMap *map)

{
  pointer pEVar1;
  mapped_type *pmVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  RefPtr<wabt::interp::Extern> local_68;
  Ptr module;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
  ::clear(&map->_M_t);
  wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
            (&module,&this->store_,(Ref)(instance->obj_->module_).index);
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pEVar1 = ((module.obj_)->export_types_).
             super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)((module.obj_)->export_types_).
                       super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x28) <= uVar3)
    break;
    wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr
              (&local_68,&this->store_,
               (Ref)(instance->obj_->exports_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar3].index);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
             ::operator[](map,(key_type *)((long)&(pEVar1->name)._M_dataplus._M_p + lVar4));
    pmVar2->obj_ = local_68.obj_;
    pmVar2->store_ = local_68.store_;
    pmVar2->root_index_ = local_68.root_index_;
    local_68.obj_ = (Extern *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    wabt::interp::RefPtr<wabt::interp::Extern>::reset(&local_68);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x28;
  }
  wabt::interp::RefPtr<wabt::interp::Module>::reset(&module);
  return;
}

Assistant:

void CommandRunner::PopulateExports(const Instance::Ptr& instance,
                                    ExportMap* map) {
  map->clear();
  interp::Module::Ptr module{store_, instance->module()};
  for (size_t i = 0; i < module->export_types().size(); ++i) {
    const ExportType& export_type = module->export_types()[i];
    (*map)[export_type.name] = store_.UnsafeGet<Extern>(instance->exports()[i]);
  }
}